

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O3

void __thiscall nuraft::timer_helper::reset(timer_helper *this)

{
  rep rVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar2 == 0) {
    rVar1 = std::chrono::_V2::system_clock::now();
    (this->t_created_).__d.__r = rVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> l(lock_);
        t_created_ = std::chrono::system_clock::now();
    }